

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall re2::Prog::Prog(Prog *this)

{
  int iVar1;
  
  this->anchor_start_ = false;
  this->anchor_end_ = false;
  this->reversed_ = false;
  this->did_flatten_ = false;
  this->did_onepass_ = false;
  this->start_ = 0;
  this->start_unanchored_ = 0;
  this->size_ = 0;
  this->bytemap_range_ = 0;
  this->first_byte_ = -1;
  this->flags_ = 0;
  this->onepass_statesize_ = 0;
  this->inst_ = (Inst *)0x0;
  iVar1 = pthread_rwlock_init((pthread_rwlock_t *)&this->dfa_mutex_,(pthread_rwlockattr_t *)0x0);
  if (iVar1 == 0) {
    (this->dfa_first_)._M_b._M_p = (__pointer_type)0x0;
    (this->dfa_longest_)._M_b._M_p = (__pointer_type)0x0;
    this->dfa_mem_ = 0;
    this->onepass_nodes_ = (uint8 *)0x0;
    this->onepass_start_ = (OneState *)0x0;
    (this->first_byte_once_)._M_once = 0;
    return;
  }
  abort();
}

Assistant:

Prog::Prog()
  : anchor_start_(false),
    anchor_end_(false),
    reversed_(false),
    did_flatten_(false),
    did_onepass_(false),
    start_(0),
    start_unanchored_(0),
    size_(0),
    bytemap_range_(0),
    first_byte_(-1),
    flags_(0),
    onepass_statesize_(0),
    inst_(NULL),
    dfa_first_(NULL),
    dfa_longest_(NULL),
    dfa_mem_(0),
    onepass_nodes_(NULL),
    onepass_start_(NULL) {
}